

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolortransform.cpp
# Opt level: O3

void __thiscall
QColorTransformPrivate::apply<QCmyk32,unsigned_char>
          (QColorTransformPrivate *this,QCmyk32 *dst,uchar *src,qsizetype count,TransformFlags flags
          )

{
  bool bVar1;
  long lVar2;
  long len;
  long in_FS_OFFSET;
  QUninitialized<QColorVector,_256> buffer;
  QColorVector local_1038 [256];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QColorSpacePrivate::isThreeComponentMatrix((this->colorSpaceIn).d.ptr);
  if (bVar1) {
    updateLutsIn(this);
  }
  bVar1 = QColorSpacePrivate::isThreeComponentMatrix((this->colorSpaceOut).d.ptr);
  if (bVar1) {
    updateLutsOut(this);
  }
  if (0 < count) {
    lVar2 = 0;
    do {
      len = count - lVar2;
      if (0xff < len) {
        len = 0x100;
      }
      applyConvertIn<unsigned_char>(this,src + lVar2,local_1038,len,flags);
      pcsAdapt(this,local_1038,len);
      applyConvertOut<QCmyk32,unsigned_char>(this,dst + lVar2,src + lVar2,local_1038,len,flags);
      lVar2 = lVar2 + len;
    } while (lVar2 < count);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorTransformPrivate::apply(D *dst, const S *src, qsizetype count, TransformFlags flags) const
{
    if (colorSpaceIn->isThreeComponentMatrix())
        updateLutsIn();
    if (colorSpaceOut->isThreeComponentMatrix())
        updateLutsOut();

    Q_DECL_UNINITIALIZED QUninitialized<QColorVector, WorkBlockSize> buffer;
    qsizetype i = 0;
    while (i < count) {
        const qsizetype len = qMin(count - i, WorkBlockSize);

        applyConvertIn(src + i, buffer, len, flags);

        pcsAdapt(buffer, len);

        applyConvertOut(dst + i, src + i, buffer, len, flags);

        i += len;
    }
}